

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int jsonParseValue(JsonParse *pParse,u32 i)

{
  u8 *puVar1;
  byte bVar2;
  byte bVar3;
  char *pcVar4;
  byte bVar5;
  long lVar6;
  ushort uVar7;
  int iVar8;
  char cVar9;
  ulong uVar10;
  u32 uVar11;
  uint uVar12;
  u8 uVar13;
  int iVar14;
  long lVar16;
  uint uVar17;
  uint uVar18;
  char *__s1;
  bool bVar19;
  ulong uVar15;
  
  pcVar4 = pParse->zJson;
  uVar10 = (ulong)i;
  do {
    uVar15 = uVar10;
    iVar14 = (int)uVar15;
    bVar2 = pcVar4[uVar15];
    uVar17 = iVar14 + 1;
    uVar10 = (ulong)uVar17;
  } while (""[bVar2] != '\0');
  if (bVar2 == 0x7b) {
    uVar17 = jsonParseAddNode(pParse,7,0,(char *)0x0);
    if (-1 < (int)uVar17) {
      do {
        do {
          iVar14 = (int)uVar15;
          uVar15 = (ulong)(iVar14 + 1U);
        } while (""[(byte)pcVar4[uVar15]] != '\0');
        uVar7 = pParse->iDepth + 1;
        pParse->iDepth = uVar7;
        if (2000 < uVar7) {
          return -1;
        }
        uVar18 = jsonParseValue(pParse,iVar14 + 1U);
        if ((int)uVar18 < 0) {
          pParse->iDepth = pParse->iDepth - 1;
          bVar19 = uVar18 == 0xfffffffe;
          goto LAB_001b5222;
        }
        if (pParse->oom != '\0') {
          return -1;
        }
        uVar12 = pParse->nNode - 1;
        if (pParse->aNode[uVar12].eType != '\x05') {
          return -1;
        }
        puVar1 = &pParse->aNode[uVar12].jnFlags;
        *puVar1 = *puVar1 | 0x40;
        do {
          uVar10 = (ulong)uVar18;
          uVar18 = uVar18 + 1;
        } while (""[(byte)pcVar4[uVar10]] != '\0');
        if (pcVar4[uVar10] != 0x3a) {
          return -1;
        }
        uVar18 = jsonParseValue(pParse,uVar18);
        pParse->iDepth = pParse->iDepth - 1;
        if ((int)uVar18 < 0) {
          return -1;
        }
        do {
          uVar12 = uVar18;
          bVar2 = pcVar4[uVar12];
          uVar18 = uVar12 + 1;
        } while (""[bVar2] != '\0');
        uVar15 = (ulong)uVar12;
      } while (bVar2 == 0x2c);
      bVar19 = bVar2 == 0x7d;
LAB_001b5188:
      if (!bVar19) {
        return -1;
      }
      pParse->aNode[uVar17].n = ~uVar17 + pParse->nNode;
      return uVar18;
    }
  }
  else if (bVar2 == 0x5b) {
    uVar17 = jsonParseAddNode(pParse,6,0,(char *)0x0);
    if (-1 < (int)uVar17) {
      do {
        do {
          iVar14 = (int)uVar15;
          uVar15 = (ulong)(iVar14 + 1U);
        } while (""[(byte)pcVar4[uVar15]] != '\0');
        uVar7 = pParse->iDepth + 1;
        pParse->iDepth = uVar7;
        if (2000 < uVar7) {
          return -1;
        }
        uVar18 = jsonParseValue(pParse,iVar14 + 1U);
        pParse->iDepth = pParse->iDepth - 1;
        if ((int)uVar18 < 0) {
          bVar19 = uVar18 == 0xfffffffd;
LAB_001b5222:
          if (!bVar19) {
            return -1;
          }
          if (pParse->nNode != uVar17 + 1) {
            return -1;
          }
          return iVar14 + 2;
        }
        do {
          uVar12 = uVar18;
          bVar2 = pcVar4[uVar12];
          uVar18 = uVar12 + 1;
        } while (""[bVar2] != '\0');
        uVar15 = (ulong)uVar12;
      } while (bVar2 == 0x2c);
      bVar19 = bVar2 == 0x5d;
      goto LAB_001b5188;
    }
  }
  else {
    __s1 = pcVar4 + uVar15;
    if (bVar2 == 0x66) {
      iVar8 = strncmp(__s1,"false",5);
      if ((iVar8 == 0) && (uVar18 = iVar14 + 5, (""[(byte)pcVar4[uVar18]] & 6) == 0)) {
        uVar11 = 2;
LAB_001b520e:
        jsonParseAddNode(pParse,uVar11,0,(char *)0x0);
        return uVar18;
      }
    }
    else if (bVar2 == 0x6e) {
      iVar8 = strncmp(__s1,"null",4);
      if ((iVar8 == 0) && (uVar18 = iVar14 + 4, (""[(byte)pcVar4[uVar18]] & 6) == 0)) {
        uVar11 = 0;
        goto LAB_001b520e;
      }
    }
    else if (bVar2 == 0x74) {
      iVar8 = strncmp(__s1,"true",4);
      if ((iVar8 == 0) && (uVar18 = iVar14 + 4, (""[(byte)pcVar4[uVar18]] & 6) == 0)) {
        uVar11 = 1;
        goto LAB_001b520e;
      }
    }
    else if (bVar2 == 0x22) {
      uVar13 = '\0';
switchD_001b4e5a_caseD_6e:
      do {
        while( true ) {
          iVar14 = (int)uVar15;
          uVar15 = (ulong)(iVar14 + 1);
          bVar2 = pcVar4[uVar15];
          if (bVar2 < 0x20) {
            return -1;
          }
          if (bVar2 == 0x5c) break;
          if (bVar2 == 0x22) {
            jsonParseAddNode(pParse,5,(iVar14 - uVar17) + 3,__s1);
            if (pParse->oom != '\0') {
              return iVar14 + 2;
            }
            pParse->aNode[pParse->nNode - 1].jnFlags = uVar13;
            return iVar14 + 2;
          }
        }
        uVar15 = (ulong)(iVar14 + 2);
        bVar2 = pcVar4[uVar15];
        uVar13 = '\x02';
      } while ((bVar2 - 0x2f < 0x38) &&
              ((0x88200000000001U >> ((ulong)(bVar2 - 0x2f) & 0x3f) & 1) != 0));
      switch(bVar2) {
      case 0x6e:
      case 0x72:
      case 0x74:
        goto switchD_001b4e5a_caseD_6e;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
        goto switchD_001b4e5a_caseD_6f;
      case 0x75:
        lVar16 = 0;
        while (lVar16 != 4) {
          lVar6 = lVar16 + uVar15 + 1;
          lVar16 = lVar16 + 1;
          if ((""[(byte)pcVar4[lVar6]] & 8) == 0) {
            return -1;
          }
        }
        goto switchD_001b4e5a_caseD_6e;
      default:
        if (bVar2 != 0x22) {
          return -1;
        }
        goto switchD_001b4e5a_caseD_6e;
      }
    }
    if (bVar2 == 0x2d || (byte)(bVar2 - 0x30) < 10) {
      if (((0x30 < bVar2) || (pcVar4[((bVar2 == 0x2d) + uVar17) - 1] != '0')) ||
         (9 < (byte)(pcVar4[(bVar2 == 0x2d) + uVar17] - 0x30U))) {
        bVar2 = 1;
        bVar5 = bVar2;
        while( true ) {
          while( true ) {
            uVar11 = ((int)uVar15 - uVar17) + 1;
            do {
              uVar10 = uVar15;
              iVar14 = (int)uVar10;
              uVar15 = (ulong)(iVar14 + 1U);
              bVar3 = pcVar4[uVar15];
              uVar11 = uVar11 + 1;
            } while ((byte)(bVar3 - 0x30) < 10);
            if (bVar3 != 0x2e) break;
            bVar19 = (bool)(pcVar4[uVar10] != '-' & bVar2);
            bVar2 = 0;
            if (!bVar19) {
              return -1;
            }
          }
          if ((bVar3 & 0xdf) != 0x45) {
            if (pcVar4[uVar10] < '0') {
              return -1;
            }
            jsonParseAddNode(pParse,4 - bVar2,uVar11,__s1);
            return iVar14 + 1U;
          }
          if ((~bVar5 & 1) != 0 || pcVar4[uVar10] < '0') break;
          cVar9 = pcVar4[iVar14 + 2];
          if ((cVar9 == '-') || (cVar9 == '+')) {
            cVar9 = pcVar4[iVar14 + 3];
            uVar15 = (ulong)(iVar14 + 2);
          }
          bVar2 = 0;
          bVar5 = bVar2;
          if ((byte)(cVar9 - 0x3aU) < 0xf6) {
            return -1;
          }
        }
        return -1;
      }
    }
    else {
      if (bVar2 == 0) {
        return 0;
      }
      if (bVar2 == 0x7d) {
        return -2;
      }
      if (bVar2 == 0x5d) {
        return -3;
      }
    }
  }
switchD_001b4e5a_caseD_6f:
  return -1;
}

Assistant:

static int jsonParseValue(JsonParse *pParse, u32 i){
  char c;
  u32 j;
  int iThis;
  int x;
  JsonNode *pNode;
  const char *z = pParse->zJson;
  while( safe_isspace(z[i]) ){ i++; }
  if( (c = z[i])=='{' ){
    /* Parse object */
    iThis = jsonParseAddNode(pParse, JSON_OBJECT, 0, 0);
    if( iThis<0 ) return -1;
    for(j=i+1;;j++){
      while( safe_isspace(z[j]) ){ j++; }
      if( ++pParse->iDepth > JSON_MAX_DEPTH ) return -1;
      x = jsonParseValue(pParse, j);
      if( x<0 ){
        pParse->iDepth--;
        if( x==(-2) && pParse->nNode==(u32)iThis+1 ) return j+1;
        return -1;
      }
      if( pParse->oom ) return -1;
      pNode = &pParse->aNode[pParse->nNode-1];
      if( pNode->eType!=JSON_STRING ) return -1;
      pNode->jnFlags |= JNODE_LABEL;
      j = x;
      while( safe_isspace(z[j]) ){ j++; }
      if( z[j]!=':' ) return -1;
      j++;
      x = jsonParseValue(pParse, j);
      pParse->iDepth--;
      if( x<0 ) return -1;
      j = x;
      while( safe_isspace(z[j]) ){ j++; }
      c = z[j];
      if( c==',' ) continue;
      if( c!='}' ) return -1;
      break;
    }
    pParse->aNode[iThis].n = pParse->nNode - (u32)iThis - 1;
    return j+1;
  }else if( c=='[' ){
    /* Parse array */
    iThis = jsonParseAddNode(pParse, JSON_ARRAY, 0, 0);
    if( iThis<0 ) return -1;
    for(j=i+1;;j++){
      while( safe_isspace(z[j]) ){ j++; }
      if( ++pParse->iDepth > JSON_MAX_DEPTH ) return -1;
      x = jsonParseValue(pParse, j);
      pParse->iDepth--;
      if( x<0 ){
        if( x==(-3) && pParse->nNode==(u32)iThis+1 ) return j+1;
        return -1;
      }
      j = x;
      while( safe_isspace(z[j]) ){ j++; }
      c = z[j];
      if( c==',' ) continue;
      if( c!=']' ) return -1;
      break;
    }
    pParse->aNode[iThis].n = pParse->nNode - (u32)iThis - 1;
    return j+1;
  }else if( c=='"' ){
    /* Parse string */
    u8 jnFlags = 0;
    j = i+1;
    for(;;){
      c = z[j];
      if( (c & ~0x1f)==0 ){
        /* Control characters are not allowed in strings */
        return -1;
      }
      if( c=='\\' ){
        c = z[++j];
        if( c=='"' || c=='\\' || c=='/' || c=='b' || c=='f'
           || c=='n' || c=='r' || c=='t'
           || (c=='u' && jsonIs4Hex(z+j+1)) ){
          jnFlags = JNODE_ESCAPE;
        }else{
          return -1;
        }
      }else if( c=='"' ){
        break;
      }
      j++;
    }
    jsonParseAddNode(pParse, JSON_STRING, j+1-i, &z[i]);
    if( !pParse->oom ) pParse->aNode[pParse->nNode-1].jnFlags = jnFlags;
    return j+1;
  }else if( c=='n'
         && strncmp(z+i,"null",4)==0
         && !safe_isalnum(z[i+4]) ){
    jsonParseAddNode(pParse, JSON_NULL, 0, 0);
    return i+4;
  }else if( c=='t'
         && strncmp(z+i,"true",4)==0
         && !safe_isalnum(z[i+4]) ){
    jsonParseAddNode(pParse, JSON_TRUE, 0, 0);
    return i+4;
  }else if( c=='f'
         && strncmp(z+i,"false",5)==0
         && !safe_isalnum(z[i+5]) ){
    jsonParseAddNode(pParse, JSON_FALSE, 0, 0);
    return i+5;
  }else if( c=='-' || (c>='0' && c<='9') ){
    /* Parse number */
    u8 seenDP = 0;
    u8 seenE = 0;
    assert( '-' < '0' );
    if( c<='0' ){
      j = c=='-' ? i+1 : i;
      if( z[j]=='0' && z[j+1]>='0' && z[j+1]<='9' ) return -1;
    }
    j = i+1;
    for(;; j++){
      c = z[j];
      if( c>='0' && c<='9' ) continue;
      if( c=='.' ){
        if( z[j-1]=='-' ) return -1;
        if( seenDP ) return -1;
        seenDP = 1;
        continue;
      }
      if( c=='e' || c=='E' ){
        if( z[j-1]<'0' ) return -1;
        if( seenE ) return -1;
        seenDP = seenE = 1;
        c = z[j+1];
        if( c=='+' || c=='-' ){
          j++;
          c = z[j+1];
        }
        if( c<'0' || c>'9' ) return -1;
        continue;
      }
      break;
    }
    if( z[j-1]<'0' ) return -1;
    jsonParseAddNode(pParse, seenDP ? JSON_REAL : JSON_INT,
                        j - i, &z[i]);
    return j;
  }else if( c=='}' ){
    return -2;  /* End of {...} */
  }else if( c==']' ){
    return -3;  /* End of [...] */
  }else if( c==0 ){
    return 0;   /* End of file */
  }else{
    return -1;  /* Syntax error */
  }
}